

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O0

unsigned_short __thiscall
Assimp::StreamReader<false,_false>::Get<unsigned_short>(StreamReader<false,_false> *this)

{
  DeadlyImportError *this_00;
  Getter<false,_unsigned_short,_false> local_49;
  unsigned_short local_48;
  undefined1 local_45;
  unsigned_short f;
  allocator local_31;
  string local_30;
  StreamReader<false,_false> *local_10;
  StreamReader<false,_false> *this_local;
  
  local_10 = this;
  if (this->limit < this->current + 2) {
    local_45 = 1;
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_30,"End of file or stream limit was reached",&local_31);
    DeadlyImportError::DeadlyImportError(this_00,&local_30);
    local_45 = 0;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  local_48 = *(unsigned_short *)this->current;
  Intern::Getter<false,_unsigned_short,_false>::operator()(&local_49,&local_48,(bool)(this->le & 1))
  ;
  this->current = this->current + 2;
  return local_48;
}

Assistant:

T Get() {
        if ( current + sizeof(T) > limit) {
            throw DeadlyImportError("End of file or stream limit was reached");
        }

        T f;
        ::memcpy (&f, current, sizeof(T));
        Intern::Getter<SwapEndianess,T,RuntimeSwitch>() (&f,le);
        current += sizeof(T);

        return f;
    }